

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_wd_add_leaflist(lyd_node **tree,lyd_node *last_parent,lys_node_leaflist *llist,
                       unres_data *unres,int check_when_must)

{
  lyd_node *plVar1;
  lyd_node *plVar2;
  int iVar3;
  uint uVar4;
  lyd_node *plVar5;
  ulong uVar6;
  char **ppcVar7;
  lys_tpdf *plVar8;
  UNRES_ITEM type;
  ulong local_40;
  lyd_node *local_38;
  
  if ((llist->module->field_0x40 & 0xc) == 0) {
    return 0;
  }
  local_40 = (ulong)llist->dflt_size;
  if (local_40 == 0) {
    if (llist->min != 0) {
      return 0;
    }
    plVar8 = (llist->type).der;
    while( true ) {
      if (plVar8 == (lys_tpdf *)0x0) {
        return 0;
      }
      if (plVar8->dflt != (char *)0x0) break;
      plVar8 = (plVar8->type).der;
    }
    ppcVar7 = &plVar8->dflt;
    local_40 = 1;
  }
  else {
    ppcVar7 = llist->dflt;
  }
  uVar6 = 0;
  local_38 = (lyd_node *)0x0;
  do {
    plVar5 = lyd_new_dummy(*tree,last_parent,(lys_node *)llist,ppcVar7[uVar6],1);
    if (plVar5 == (lyd_node *)0x0) goto LAB_00163965;
    plVar2 = plVar5;
    if ((local_38 != (lyd_node *)0x0) && (plVar2 = local_38, plVar5->parent == (lyd_node *)0x0)) {
      plVar1 = local_38->prev;
      plVar1->next = plVar5;
      plVar5->prev = plVar1;
      local_38->prev = plVar5;
    }
    while( true ) {
      local_38 = plVar2;
      if ((check_when_must != 0) &&
         (((((plVar5->field_0x9 & 8) != 0 &&
            (iVar3 = unres_data_add(unres,plVar5,UNRES_WHEN), iVar3 == -1)) ||
           ((uVar4 = resolve_applies_must(plVar5), (uVar4 & 1) != 0 &&
            (iVar3 = unres_data_add(unres,plVar5,UNRES_MUST), iVar3 == -1)))) ||
          (((uVar4 & 2) != 0 && (iVar3 = unres_data_add(unres,plVar5,UNRES_MUST_INOUT), iVar3 == -1)
           ))))) goto LAB_00163965;
      plVar5->validity = plVar5->validity & 0x7f;
      if ((lys_node_leaflist *)plVar5->schema == llist) break;
      plVar5 = plVar5->child;
      plVar2 = local_38;
    }
    if (*(short *)&plVar5[1].validity == 8) {
      type = UNRES_INSTID;
LAB_001638d1:
      iVar3 = unres_data_add(unres,plVar5,type);
      if (iVar3 != 0) goto LAB_00163965;
    }
    else if (*(short *)&plVar5[1].validity == 9) {
      type = UNRES_LEAFREF;
      goto LAB_001638d1;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != local_40);
  plVar5 = *tree;
  if (local_38->parent == (lyd_node *)0x0) {
    if (plVar5 != (lyd_node *)0x0) {
      iVar3 = lyd_insert_common(plVar5->parent,tree,local_38,1);
      if (iVar3 != 0) {
LAB_00163965:
        lyd_free_withsiblings(local_38);
        return 1;
      }
      goto LAB_00163989;
    }
  }
  else if (plVar5 != (lyd_node *)0x0) goto LAB_00163989;
  *tree = local_38;
LAB_00163989:
  lyd_wd_update_parents(local_38);
  return 0;
}

Assistant:

static int
lyd_wd_add_leaflist(struct lyd_node **tree, struct lyd_node *last_parent, struct lys_node_leaflist *llist,
                    struct unres_data *unres, int check_when_must)
{
    struct lyd_node *dummy, *current, *first = NULL;
    struct lys_tpdf *tpdf;
    const char **dflt = NULL;
    uint8_t dflt_size = 0;
    int i, ret;

    if (llist->module->version < 2) {
        /* default values on leaf-lists are allowed from YANG 1.1 */
        return EXIT_SUCCESS;
    }

    /* get know if there is a default value */
    if (llist->dflt_size) {
        /* there are default values */
        dflt_size = llist->dflt_size;
        dflt = llist->dflt;
    } else if (!llist->min) {
        /* get the default value from the type */
        for (tpdf = llist->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
            if (tpdf->dflt) {
                dflt = &tpdf->dflt;
                dflt_size = 1;
                break;
            }
        }
    }

    if (!dflt_size) {
        /* no default values to use */
        return EXIT_SUCCESS;
    }

    for (i = 0; i < dflt_size; i++) {
        /* create the node */
        if (!(dummy = lyd_new_dummy(*tree, last_parent, (struct lys_node*)llist, dflt[i], 1))) {
            goto error;
        }

        if (!first) {
            first = dummy;
        } else if (!dummy->parent) {
            /* interconnect with the rest of leaf-lists */
            first->prev->next = dummy;
            dummy->prev = first->prev;
            first->prev = dummy;
        }

        for (current = dummy; ; current = current->child) {
            /* remember the created data in unres */
            if (check_when_must) {
                if ((current->when_status & LYD_WHEN) && unres_data_add(unres, current, UNRES_WHEN) == -1) {
                    goto error;
                }
                ret = resolve_applies_must(current);
                if ((ret & 0x1) && (unres_data_add(unres, current, UNRES_MUST) == -1)) {
                    goto error;
                }
                if ((ret & 0x2) && (unres_data_add(unres, current, UNRES_MUST_INOUT) == -1)) {
                    goto error;
                }
            }

            /* clear dummy-node flag */
            current->validity &= ~LYD_VAL_INUSE;

            if (current->schema == (struct lys_node *)llist) {
                break;
            }
        }

        /* if necessary, remember the created data value in unres */
        if (((struct lyd_node_leaf_list *)current)->value_type == LY_TYPE_LEAFREF) {
            if (unres_data_add(unres, current, UNRES_LEAFREF)) {
                goto error;
            }
        } else if (((struct lyd_node_leaf_list *)current)->value_type == LY_TYPE_INST) {
            if (unres_data_add(unres, current, UNRES_INSTID)) {
                goto error;
            }
        }
    }

    /* insert into the tree */
    if (first && !first->parent && (*tree)) {
        /* connect dummy nodes into the data tree (at the end of top level nodes) */
        if (lyd_insert_sibling(tree, first)) {
            goto error;
        }
    } else if (!(*tree)) {
        *tree = first;
    }

    /* update parent's default flag if needed */
    lyd_wd_update_parents(first);

    return EXIT_SUCCESS;

error:
    lyd_free_withsiblings(first);
    return EXIT_FAILURE;
}